

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int-var-sl.cpp
# Opt level: O2

bool __thiscall IntVarSL::setVal(IntVarSL *this,int64_t v,Reason r,bool channel)

{
  int iVar1;
  int v_00;
  
  v_00 = (int)v;
  iVar1 = find_index(this,v_00,ROUND_NONE);
  if (iVar1 == -1) {
    if (channel) {
      SAT::cEnqueue(&sat,(Lit)0x0,r);
      return false;
    }
  }
  else {
    iVar1 = (*(this->el->super_IntVar).super_Var.super_Branching._vptr_Branching[0x10])
                      (this->el,(long)iVar1,r.field_0,(ulong)channel);
    if ((char)iVar1 != '\0') {
      if ((this->super_IntVar).min.v < v) {
        Tint::operator=(&(this->super_IntVar).min,v_00);
      }
      if ((this->super_IntVar).max.v <= v) {
        return true;
      }
      Tint::operator=(&(this->super_IntVar).max,v_00);
      return true;
    }
  }
  return false;
}

Assistant:

bool IntVarSL::setVal(int64_t v, Reason r, bool channel) {
	assert(setValNotR(v));
	const int u = find_index(static_cast<int>(v), ROUND_NONE);
	if (u == -1) {
		if (channel) {
			sat.cEnqueue(lit_False, r);
		}
		assert(sat.confl);
		return false;
	}
	if (!el->setVal(u, r, channel)) {
		return false;
	}
	if (min < v) {
		min = static_cast<int>(v);
	}
	if (max > v) {
		max = static_cast<int>(v);
	}
	return true;
}